

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool PrepareArgumentsForFunctionCall
               (ExpressionContext *ctx,SynBase *source,ArrayView<ArgumentData> functionArguments,
               ArrayView<ArgumentData> arguments,SmallArray<CallArgumentData,_16U> *result,
               uint *extraRating,bool prepareValues)

{
  uint uVar1;
  SynIdentifier *pSVar2;
  SynBase *source_00;
  Allocator *pAVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeUnsizedArray *type;
  CallArgumentData *pCVar4;
  TypeBase *pTVar5;
  TypeUnsizedArray *pTVar6;
  undefined4 extraout_var_01;
  TypeArray *pTVar7;
  undefined4 extraout_var_02;
  ExprBase *pEVar8;
  SynIdentifier **ppSVar9;
  ArgumentData *pAVar10;
  int iVar11;
  uint uVar12;
  ExprBase **ppEVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ArgumentData *pAVar17;
  ulong uVar18;
  ulong uVar19;
  uint e;
  TypeBase **ppTVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  ArrayView<ArgumentData> arguments_00;
  IntrusiveList<ExprBase> values;
  IntrusiveList<ExprBase> local_58;
  ulong local_48;
  ArrayView<ArgumentData> local_40;
  
  pAVar17 = arguments.data;
  uVar19 = functionArguments._8_8_;
  pAVar10 = functionArguments.data;
  uVar16 = arguments.count;
  uVar12 = functionArguments.count;
  result->count = 0;
  bVar23 = uVar16 != 0;
  if ((bVar23) && (pAVar17->name == (SynIdentifier *)0x0)) {
    ppSVar9 = &pAVar17[1].name;
    uVar18 = 1;
    do {
      uVar15 = uVar18;
      if (uVar16 == uVar15) break;
      pSVar2 = *ppSVar9;
      ppSVar9 = ppSVar9 + 6;
      uVar18 = uVar15 + 1;
    } while (pSVar2 == (SynIdentifier *)0x0);
    bVar23 = uVar15 < uVar16;
  }
  local_40.data = pAVar10;
  local_40.count = uVar12;
  if (bVar23) {
    arguments_00._12_4_ = 0;
    arguments_00.data = (ArgumentData *)SUB128(arguments._0_12_,0);
    arguments_00.count = SUB124(arguments._0_12_,8);
    bVar23 = HasMatchingArgumentNames(&local_40,arguments_00);
    if (!bVar23) {
      return false;
    }
    if (uVar16 != 0) {
      ppEVar13 = &pAVar17->value;
      uVar14 = uVar16;
      do {
        if ((SynIdentifier *)ppEVar13[-2] != (SynIdentifier *)0x0) break;
        pTVar5 = (TypeBase *)ppEVar13[-1];
        pEVar8 = *ppEVar13;
        if (result->count == result->max) {
          SmallArray<CallArgumentData,_16U>::grow(result,result->count);
        }
        pCVar4 = result->data;
        if (pCVar4 == (CallArgumentData *)0x0) goto LAB_001f564e;
        uVar1 = result->count;
        result->count = uVar1 + 1;
        pCVar4[uVar1].type = pTVar5;
        pCVar4[uVar1].value = pEVar8;
        ppEVar13 = ppEVar13 + 6;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    uVar14 = result->count;
    uVar18 = (ulong)uVar14;
    if (uVar14 < uVar12) {
      iVar11 = uVar12 - uVar14;
      do {
        if (result->count == result->max) {
          SmallArray<CallArgumentData,_16U>::grow(result,result->count);
        }
        if (result->data == (CallArgumentData *)0x0) {
LAB_001f564e:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<CallArgumentData, 16>::push_back(const T &) [T = CallArgumentData, N = 16]"
                       );
        }
        uVar1 = result->count;
        result->count = uVar1 + 1;
        pCVar4 = result->data + uVar1;
        pCVar4->type = (TypeBase *)0x0;
        pCVar4->value = (ExprBase *)0x0;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    local_48 = uVar18;
    if (uVar14 < uVar16) {
      do {
        if (pAVar17[uVar18].name != (SynIdentifier *)0x0 && uVar12 != 0) {
          uVar21 = 0;
          uVar15 = 1;
          ppSVar9 = &pAVar10->name;
          do {
            uVar14 = (uint)uVar21;
            if ((*ppSVar9 == (SynIdentifier *)0x0) ||
               (bVar23 = InplaceStr::operator==(&(*ppSVar9)->name,&(pAVar17[uVar18].name)->name),
               !bVar23)) {
              uVar21 = (ulong)(uVar14 + 1);
              bVar23 = true;
            }
            else {
              if (result->count <= uVar14) goto LAB_001f562f;
              if (result->data[uVar21].type != (TypeBase *)0x0) {
                anon_unknown.dwarf_11255e::Stop
                          (ctx,(pAVar17[uVar18].value)->source,
                           "ERROR: argument \'%.*s\' is already set",
                           (ulong)(uint)(*(int *)&((pAVar17[uVar18].name)->name).end -
                                        (int)((pAVar17[uVar18].name)->name).begin));
              }
              if (result->count <= uVar14) goto LAB_001f562f;
              pEVar8 = pAVar17[uVar18].value;
              pCVar4 = result->data;
              pCVar4[uVar21].type = pAVar17[uVar18].type;
              pCVar4[uVar21].value = pEVar8;
              bVar23 = false;
            }
            if (!bVar23) break;
            ppSVar9 = ppSVar9 + 6;
            bVar23 = uVar15 < (uVar19 & 0xffffffff);
            uVar15 = uVar15 + 1;
          } while (bVar23);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar16);
    }
    if (uVar12 != 0) {
      ppEVar13 = &pAVar10->value;
      lVar22 = 8;
      uVar18 = 0;
      do {
        if (result->count <= uVar18) goto LAB_001f562f;
        if ((*(long *)((long)result->data + lVar22 + -8) == 0) &&
           (pEVar8 = *ppEVar13, pEVar8 != (ExprBase *)0x0)) {
          pTVar5 = pEVar8->type;
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ExprPassthrough::ExprPassthrough
                    ((ExprPassthrough *)CONCAT44(extraout_var,iVar11),pEVar8->source,pEVar8->type,
                     pEVar8);
          if (result->count <= uVar18) goto LAB_001f562f;
          pCVar4 = result->data;
          *(TypeBase **)((long)pCVar4 + lVar22 + -8) = pTVar5;
          *(ExprPassthrough **)((long)&pCVar4->type + lVar22) =
               (ExprPassthrough *)CONCAT44(extraout_var,iVar11);
        }
        uVar18 = uVar18 + 1;
        lVar22 = lVar22 + 0x10;
        ppEVar13 = ppEVar13 + 6;
      } while ((uVar19 & 0xffffffff) != uVar18);
    }
    uVar16 = (uint)local_48;
    bVar23 = uVar16 < uVar12;
    if (bVar23) {
      uVar14 = result->count;
      if (result->count < uVar16) {
        uVar14 = uVar16;
      }
      pCVar4 = result->data + local_48;
      do {
        uVar16 = uVar16 + 1;
        if (uVar16 - uVar14 == 1) {
LAB_001f562f:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<CallArgumentData, 16>::operator[](unsigned int) [T = CallArgumentData, N = 16]"
                       );
        }
        if (pCVar4->type == (TypeBase *)0x0) {
          if (bVar23) {
            return false;
          }
          break;
        }
        bVar23 = uVar16 < uVar12;
        pCVar4 = pCVar4 + 1;
      } while (uVar16 != uVar12);
    }
  }
  else {
    if (uVar16 != 0) {
      lVar22 = 0;
      do {
        pTVar5 = *(TypeBase **)((long)&pAVar17->type + lVar22);
        pEVar8 = *(ExprBase **)((long)&pAVar17->value + lVar22);
        if (result->count == result->max) {
          SmallArray<CallArgumentData,_16U>::grow(result,result->count);
        }
        pCVar4 = result->data;
        if (pCVar4 == (CallArgumentData *)0x0) goto LAB_001f564e;
        uVar14 = result->count;
        result->count = uVar14 + 1;
        pCVar4[uVar14].type = pTVar5;
        pCVar4[uVar14].value = pEVar8;
        lVar22 = lVar22 + 0x30;
      } while ((ulong)uVar16 * 0x30 != lVar22);
    }
    uVar16 = result->count;
    if (uVar16 < uVar12) {
      ppEVar13 = &pAVar10[uVar16].value;
      lVar22 = (uVar19 & 0xffffffff) - (ulong)uVar16;
      do {
        pEVar8 = *ppEVar13;
        if (pEVar8 != (ExprBase *)0x0) {
          pTVar5 = pEVar8->type;
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ExprPassthrough::ExprPassthrough
                    ((ExprPassthrough *)CONCAT44(extraout_var_00,iVar11),pEVar8->source,pEVar8->type
                     ,pEVar8);
          if (result->count == result->max) {
            SmallArray<CallArgumentData,_16U>::grow(result,result->count);
          }
          pCVar4 = result->data;
          if (pCVar4 == (CallArgumentData *)0x0) goto LAB_001f564e;
          uVar16 = result->count;
          result->count = uVar16 + 1;
          pCVar4[uVar16].type = pTVar5;
          pCVar4[uVar16].value = (ExprBase *)CONCAT44(extraout_var_00,iVar11);
        }
        ppEVar13 = ppEVar13 + 6;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    type = ExpressionContext::GetUnsizedArrayType(ctx,&ctx->typeAutoRef->super_TypeBase);
    if (uVar12 != 0) {
      uVar16 = uVar12 - 1;
      uVar19 = (ulong)uVar16;
      if (((((TypeUnsizedArray *)pAVar10[uVar19].type == type) &&
           (pAVar10[uVar19].isExplicit == false)) && (uVar16 <= result->count)) &&
         ((result->count != uVar12 ||
          (pCVar4 = SmallArray<CallArgumentData,_16U>::back(result),
          (TypeUnsizedArray *)pCVar4->type != type)))) {
        if (extraRating != (uint *)0x0) {
          *extraRating = (~uVar12 + result->count) * 5 + 10;
        }
        if (prepareValues) {
          if (result->count != 0) {
            source = result->data->value->source;
          }
          local_58.head = (ExprBase *)0x0;
          local_58.tail = (ExprBase *)0x0;
          if (uVar16 < result->count) {
            uVar18 = uVar19 << 4 | 8;
            do {
              pEVar8 = *(ExprBase **)((long)&result->data->type + uVar18);
              pTVar5 = pEVar8->type;
              if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0x13)) {
                pTVar5 = (TypeBase *)0x0;
              }
              if (pTVar5 != (TypeBase *)0x0) {
                source_00 = pEVar8->source;
                pTVar6 = ExpressionContext::GetUnsizedArrayType
                                   (ctx,(TypeBase *)pTVar5[1]._vptr_TypeBase);
                pEVar8 = CreateCast(ctx,source_00,pEVar8,(TypeBase *)pTVar6,false);
              }
              pEVar8 = CreateCast(ctx,pEVar8->source,pEVar8,&ctx->typeAutoRef->super_TypeBase,true);
              IntrusiveList<ExprBase>::push_back(&local_58,pEVar8);
              uVar19 = uVar19 + 1;
              uVar18 = uVar18 + 0x10;
            } while (uVar19 < result->count);
          }
          pAVar3 = ctx->allocator;
          if ((TypeUnsizedArray *)local_58.head == (TypeUnsizedArray *)0x0) {
            iVar11 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
            pEVar8 = (ExprBase *)CONCAT44(extraout_var_02,iVar11);
            pTVar5 = ctx->typeNullPtr;
            pEVar8->typeID = 9;
            pEVar8->source = source;
            pEVar8->type = pTVar5;
            pEVar8->next = (ExprBase *)0x0;
            pEVar8->listed = false;
            pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f65c8;
          }
          else {
            iVar11 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x40);
            pEVar8 = (ExprBase *)CONCAT44(extraout_var_01,iVar11);
            uVar19 = 0;
            pTVar6 = (TypeUnsizedArray *)local_58.head;
            if ((TypeUnsizedArray *)local_58.head != (TypeUnsizedArray *)0x0) {
              do {
                uVar14 = (int)uVar19 + 1;
                uVar19 = (ulong)uVar14;
                pTVar6 = (TypeUnsizedArray *)(pTVar6->super_TypeStruct).super_TypeBase.importModule;
              } while (pTVar6 != (TypeUnsizedArray *)0x0);
              uVar19 = (ulong)uVar14;
            }
            pTVar7 = ExpressionContext::GetArrayType(ctx,&ctx->typeAutoRef->super_TypeBase,uVar19);
            pEVar8->typeID = 0xf;
            pEVar8->source = source;
            pEVar8->type = &pTVar7->super_TypeBase;
            pEVar8->next = (ExprBase *)0x0;
            pEVar8->listed = false;
            pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6718;
            pEVar8[1]._vptr_ExprBase = (_func_int **)local_58.head;
            *(ExprBase **)&pEVar8[1].typeID = local_58.tail;
          }
          pEVar8 = CreateCast(ctx,source,pEVar8,(TypeBase *)type,true);
        }
        else {
          pEVar8 = (ExprBase *)0x0;
        }
        if (result->count < uVar16) {
          __assert_fail("newSize <= count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x1a8,
                        "void SmallArray<CallArgumentData, 16>::shrink(unsigned int) [T = CallArgumentData, N = 16]"
                       );
        }
        result->count = uVar16;
        local_58.head = (ExprBase *)type;
        local_58.tail = pEVar8;
        SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&local_58);
      }
    }
  }
  bVar23 = result->count == uVar12;
  if ((prepareValues && bVar23) && (bVar23 = true, result->count != 0)) {
    ppTVar20 = &pAVar10->type;
    uVar12 = 0;
    lVar22 = 8;
    do {
      pCVar4 = result->data;
      pEVar8 = *(ExprBase **)((long)&pCVar4->type + lVar22);
      if (pEVar8 == (ExprBase *)0x0) {
        __assert_fail("argument.value",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1685,
                      "bool PrepareArgumentsForFunctionCall(ExpressionContext &, SynBase *, ArrayView<ArgumentData>, ArrayView<ArgumentData>, SmallArray<CallArgumentData, 16> &, unsigned int *, bool)"
                     );
      }
      pEVar8 = CreateCast(ctx,pEVar8->source,pEVar8,*ppTVar20,true);
      *(ExprBase **)((long)&pCVar4->type + lVar22) = pEVar8;
      uVar12 = uVar12 + 1;
      ppTVar20 = ppTVar20 + 6;
      lVar22 = lVar22 + 0x10;
    } while (uVar12 < result->count);
    bVar23 = true;
  }
  return bVar23;
}

Assistant:

bool PrepareArgumentsForFunctionCall(ExpressionContext &ctx, SynBase *source, ArrayView<ArgumentData> functionArguments, ArrayView<ArgumentData> arguments, SmallArray<CallArgumentData, 16> &result, unsigned *extraRating, bool prepareValues)
{
	result.clear();

	if(HasNamedCallArguments(arguments))
	{
		if(!HasMatchingArgumentNames(functionArguments, arguments))
			return false;

		// Add first unnamed arguments
		for(unsigned i = 0; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			if(!argument.name)
				result.push_back(CallArgumentData(argument.type, argument.value));
			else
				break;
		}

		unsigned unnamedCount = result.size();

		// Reserve slots for all remaining arguments
		for(unsigned i = unnamedCount; i < functionArguments.count; i++)
			result.push_back(CallArgumentData(NULL, NULL));

		// Put named arguments in appropriate slots
		for(unsigned i = unnamedCount; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			if(!argument.name)
				continue;

			unsigned targetPos = 0;

			for(unsigned k = 0; k < functionArguments.count; k++)
			{
				ArgumentData &functionArgument = functionArguments.data[k];

				if(functionArgument.name && functionArgument.name->name == argument.name->name)
				{
					if(result[targetPos].type != NULL)
						Stop(ctx, argument.value->source, "ERROR: argument '%.*s' is already set", FMT_ISTR(argument.name->name));

					result[targetPos] = CallArgumentData(argument.type, argument.value);
					break;
				}

				targetPos++;
			}
		}

		// Fill in any unset arguments with default values
		for(unsigned i = 0; i < functionArguments.count; i++)
		{
			ArgumentData &argument = functionArguments.data[i];

			if(result[i].type == NULL)
			{
				if(ExprBase *value = argument.value)
					result[i] = CallArgumentData(value->type, new (ctx.get<ExprPassthrough>()) ExprPassthrough(value->source, value->type, value));
			}
		}

		// All arguments must be set
		for(unsigned i = unnamedCount; i < functionArguments.count; i++)
		{
			if(result[i].type == NULL)
				return false;
		}
	}
	else
	{
		// Add arguments
		for(unsigned i = 0; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			result.push_back(CallArgumentData(argument.type, argument.value));
		}

		// Add any arguments with default values
		for(unsigned i = result.count; i < functionArguments.count; i++)
		{
			ArgumentData &argument = functionArguments.data[i];

			if(ExprBase *value = argument.value)
				result.push_back(CallArgumentData(value->type, new (ctx.get<ExprPassthrough>()) ExprPassthrough(value->source, value->type, value)));
		}

		// Create variadic pack if neccessary
		TypeBase *varArgType = ctx.GetUnsizedArrayType(ctx.typeAutoRef);

		if(!functionArguments.empty() && functionArguments.back().type == varArgType && !functionArguments.back().isExplicit)
		{
			if(result.size() >= functionArguments.size() - 1 && !(result.size() == functionArguments.size() && result.back().type == varArgType))
			{
				if(extraRating)
					*extraRating = 10 + (result.size() - functionArguments.size() - 1) * 5;

				ExprBase *value = NULL;

				if(prepareValues)
				{
					if(!result.empty())
						source = result[0].value->source;

					IntrusiveList<ExprBase> values;

					for(unsigned i = functionArguments.size() - 1; i < result.size(); i++)
					{
						ExprBase *value = result[i].value;

						if(TypeArray *arrType = getType<TypeArray>(value->type))
						{
							// type[N] is converted to type[] first
							value = CreateCast(ctx, value->source, value, ctx.GetUnsizedArrayType(arrType->subType), false);
						}

						values.push_back(CreateCast(ctx, value->source, value, ctx.typeAutoRef, true));
					}

					if(values.empty())
						value = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.typeNullPtr);
					else
						value = new (ctx.get<ExprArray>()) ExprArray(source, ctx.GetArrayType(ctx.typeAutoRef, values.size()), values);

					value = CreateCast(ctx, source, value, varArgType, true);
				}

				result.shrink(functionArguments.size() - 1);
				result.push_back(CallArgumentData(varArgType, value));
			}
		}
	}

	if(result.size() != functionArguments.size())
		return false;

	// Convert all arguments to target type if this is a real call
	if(prepareValues)
	{
		for(unsigned i = 0; i < result.count; i++)
		{
			CallArgumentData &argument = result.data[i];

			assert(argument.value);

			TypeBase *target = functionArguments.data[i].type;

			argument.value = CreateCast(ctx, argument.value->source, argument.value, target, true);
		}
	}

	return true;
}